

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O0

void __thiscall
gss::innards::Lackey::Lackey
          (Lackey *this,string *send_to_name,string *read_from_name,InputGraph *pattern_graph,
          InputGraph *target_graph)

{
  byte bVar1;
  undefined8 *puVar2;
  pointer pIVar3;
  string *m;
  undefined8 in_RCX;
  string *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  pointer in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  puVar2 = (undefined8 *)operator_new(0x460);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  std::mutex::mutex((mutex *)0x17ccf3);
  std::ofstream::ofstream(puVar2 + 5,in_RSI,_S_out);
  std::ifstream::ifstream(puVar2 + 0x45,in_RDX,_S_in);
  puVar2[0x86] = in_RCX;
  puVar2[0x87] = in_R8;
  puVar2[0x88] = 0;
  puVar2[0x89] = 0;
  puVar2[0x8a] = 0;
  puVar2[0x8b] = 0;
  std::unique_ptr<gss::innards::Lackey::Imp,std::default_delete<gss::innards::Lackey::Imp>>::
  unique_ptr<std::default_delete<gss::innards::Lackey::Imp>,void>
            ((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff28);
  pIVar3 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x17cd98);
  bVar1 = std::ios::operator!((ios *)(&pIVar3->read_from +
                                     *(long *)(*(long *)&pIVar3->read_from + -0x18)));
  if ((bVar1 & 1) == 0) {
    pIVar3 = std::
             unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           *)0x17cdca);
    in_stack_ffffffffffffff36 =
         std::ios::operator!((ios *)(&pIVar3->send_to + *(long *)(*(long *)&pIVar3->send_to + -0x18)
                                    ));
    if ((in_stack_ffffffffffffff36 & 1) == 0) {
      return;
    }
  }
  m = (string *)__cxa_allocate_exception(0x28);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(in_RDI,(char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff36,
                                                        in_stack_ffffffffffffff30)));
  std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)
                                ));
  DisobedientLackeyError::DisobedientLackeyError
            ((DisobedientLackeyError *)
             CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),m);
  __cxa_throw(m,&DisobedientLackeyError::typeinfo,DisobedientLackeyError::~DisobedientLackeyError);
}

Assistant:

Lackey::Lackey(const string & send_to_name, const string & read_from_name,
    const InputGraph & pattern_graph, const InputGraph & target_graph) :
    _imp(new Imp{{}, ofstream{send_to_name}, ifstream{read_from_name}, pattern_graph, target_graph})
{
    if ((! _imp->read_from) || (! _imp->send_to))
        throw DisobedientLackeyError{"error setting up lackey communication using " + send_to_name + " and " + read_from_name};
}